

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O0

bool __thiscall NaParams::CheckParam(NaParams *this,char *szParamName)

{
  void *pvVar1;
  long in_RDI;
  item_t *pit;
  item_t it;
  undefined1 local_28 [8];
  undefined8 local_20;
  
  local_20 = 0;
  pvVar1 = bsearch(local_28,*(void **)(in_RDI + 0x410),(long)*(int *)(in_RDI + 0x418),0x10,
                   stored_cmp);
  return pvVar1 != (void *)0x0;
}

Assistant:

bool
NaParams::CheckParam (const char* szParamName) const
{
  item_t	it, *pit;
  it.name = (char*)szParamName;
  it.value = NULL;

  pit = (item_t*)bsearch(&it, storage, stored_n, sizeof(item_t), stored_cmp);
  if(NULL != pit)
    return true;
  return false;
}